

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<unsigned_long_long,_duckdb_fmt::v6::basic_format_specs<char>_>::on_bin
          (int_writer<unsigned_long_long,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  undefined1 uVar1;
  uint uVar2;
  long in_RDI;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  undefined1 in_stack_00000018 [16];
  format_specs in_stack_00000030;
  int num_digits;
  int num_digits_00;
  
  if (*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x1c);
    *(uint *)(in_RDI + 0x1c) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x18 + (ulong)uVar2) = 0x30;
    uVar1 = *(undefined1 *)(*(long *)(in_RDI + 8) + 8);
    uVar2 = *(uint *)(in_RDI + 0x1c);
    *(uint *)(in_RDI + 0x1c) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x18 + (ulong)uVar2) = uVar1;
  }
  count_digits<1u,unsigned_long>(*(unsigned_long *)(in_RDI + 0x10));
  num_digits_00 = (int)((ulong)in_RDI >> 0x20);
  get_prefix((int_writer<unsigned_long_long,_duckdb_fmt::v6::basic_format_specs<char>_> *)0xefa31c);
  basic_writer<duckdb_fmt::v6::buffer_range<char>>::
  write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned_long_long,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<1>>
            (unaff_retaddr,num_digits_00,(string_view)in_stack_00000018,in_stack_00000030,
             (bin_writer<1>)in_stack_00000008);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }